

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O3

bool si9ma::SinglyLinkedList::is_palindroom2(SinglyNodeWithRand *head)

{
  SinglyNodeWithRand **ppSVar1;
  bool bVar2;
  int *piVar3;
  SinglyNodeWithRand *pSVar4;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s_stack;
  _Deque_base<int,_std::allocator<int>_> local_78;
  
  local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (int *)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (int *)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_78,0);
  bVar2 = true;
  pSVar4 = head;
  if (head != (SinglyNodeWithRand *)0x0) {
    do {
      if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_78._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                  ((deque<int,std::allocator<int>> *)&local_78,&pSVar4->value);
      }
      else {
        *local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = pSVar4->value;
        local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_78._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      ppSVar1 = &pSVar4->next;
      pSVar4 = *ppSVar1;
    } while (*ppSVar1 != (SinglyNodeWithRand *)0x0);
    piVar3 = local_78._M_impl.super__Deque_impl_data._M_finish._M_first;
    if (head != (SinglyNodeWithRand *)0x0) {
      do {
        if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur == piVar3) {
          if (head->value != local_78._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x7f])
          goto LAB_00108862;
          head = head->next;
          operator_delete(piVar3);
          piVar3 = local_78._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_78._M_impl.super__Deque_impl_data._M_finish._M_last = piVar3 + 0x80;
          local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = piVar3 + 0x7f;
          local_78._M_impl.super__Deque_impl_data._M_finish._M_first = piVar3;
          local_78._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_78._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          if (head->value != local_78._M_impl.super__Deque_impl_data._M_finish._M_cur[-1]) {
LAB_00108862:
            bVar2 = false;
            break;
          }
          local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_78._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          head = head->next;
        }
      } while (head != (SinglyNodeWithRand *)0x0);
    }
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_78);
  return bVar2;
}

Assistant:

bool SinglyLinkedList::is_palindroom2(si9ma::SinglyNodeWithRand *head) {
        auto *ptr = head;
        stack<int> s_stack;
        while (ptr != nullptr){
            s_stack.push(ptr->value);
            ptr = ptr->next;
        }

        ptr = head;
        while (ptr != nullptr){
            if (ptr->value != s_stack.top())
                return false;

            ptr = ptr->next;
            s_stack.pop();
        }

        return true;
    }